

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int codeCompare(Parse *pParse,Expr *pLeft,Expr *pRight,int opcode,int in1,int in2,int dest,
               int jumpIfNull)

{
  int *piVar1;
  char aff2;
  byte bVar2;
  CollSeq *zP4;
  Vdbe *pVVar3;
  
  zP4 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pRight);
  aff2 = sqlite3ExprAffinity(pRight);
  bVar2 = sqlite3CompareAffinity(pLeft,aff2);
  sqlite3VdbeAddOp4(pParse->pVdbe,opcode,in2,dest,in1,(char *)zP4,-3);
  pVVar3 = pParse->pVdbe;
  piVar1 = &pVVar3->nOp;
  if (0 < (long)*piVar1) {
    pVVar3 = (Vdbe *)pVVar3->aOp;
    *(ushort *)((long)pVVar3 + (long)*piVar1 * 0x18 + -0x16) =
         (ushort)(byte)(bVar2 | (byte)jumpIfNull);
  }
  return (int)pVVar3;
}

Assistant:

static int codeCompare(
  Parse *pParse,    /* The parsing (and code generating) context */
  Expr *pLeft,      /* The left operand */
  Expr *pRight,     /* The right operand */
  int opcode,       /* The comparison opcode */
  int in1, int in2, /* Register holding operands */
  int dest,         /* Jump here if true.  */
  int jumpIfNull    /* If true, jump if either operand is NULL */
){
  int p5;
  int addr;
  CollSeq *p4;

  p4 = sqlite3BinaryCompareCollSeq(pParse, pLeft, pRight);
  p5 = binaryCompareP5(pLeft, pRight, jumpIfNull);
  addr = sqlite3VdbeAddOp4(pParse->pVdbe, opcode, in2, dest, in1,
                           (void*)p4, P4_COLLSEQ);
  sqlite3VdbeChangeP5(pParse->pVdbe, (u8)p5);
  return addr;
}